

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFFormFieldObjectHelper::getDefaultAppearance_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  QPDFObjectHandle value;
  allocator<char> local_51;
  undefined1 local_50 [16];
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_50 + 0x10),"/DA",(allocator<char> *)&stack0xffffffffffffffe0);
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)local_50,(string *)this);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  bVar1 = QPDFObjectHandle::isString((QPDFObjectHandle *)local_50);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_50 + 0x10),"/DA",&local_51);
    getFieldFromAcroForm((QPDFFormFieldObjectHelper *)&stack0xffffffffffffffe0,(string *)this);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_50,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = QPDFObjectHandle::isString((QPDFObjectHandle *)local_50);
  if (bVar1) {
    QPDFObjectHandle::getUTF8Value_abi_cxx11_
              ((string *)(local_50 + 0x10),(QPDFObjectHandle *)local_50);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_50 + 0x10));
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getDefaultAppearance()
{
    auto value = getInheritableFieldValue("/DA");
    bool looked_in_acroform = false;
    if (!value.isString()) {
        value = getFieldFromAcroForm("/DA");
        looked_in_acroform = true;
    }
    std::string result;
    if (value.isString()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper DA present", looked_in_acroform ? 0 : 1);
        result = value.getUTF8Value();
    }
    return result;
}